

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day09.cpp
# Opt level: O3

void day09(input_t input)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  ulong uVar10;
  undefined1 (*pauVar11) [32];
  uint uVar12;
  iterator __begin1;
  long lVar13;
  undefined8 *__ptr;
  byte bVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  undefined8 uVar19;
  ulong uVar20;
  undefined8 uVar21;
  long lVar22;
  undefined1 (*pauVar23) [32];
  long lVar24;
  uint uVar25;
  undefined1 (*pauVar26) [32];
  int *piVar27;
  uint uVar28;
  int iVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  vector<unsigned_long,_std::allocator<unsigned_long>_> score;
  allocator_type local_49;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  if (input.len == 0) {
    uVar15 = 0;
    uVar17 = 0;
  }
  else {
    lVar13 = 0;
    uVar17 = 0;
    uVar25 = 0;
    uVar15 = 0;
    do {
      bVar14 = input.s[lVar13] - 0x30;
      uVar28 = uVar15;
      if (bVar14 < 10) {
        uVar12 = (uint)bVar14 + uVar25 * 10;
      }
      else {
        uVar12 = 0;
        if (((uVar25 != 0) && (uVar12 = uVar25, input.s[lVar13] == ' ')) &&
           (uVar28 = uVar25, uVar12 = 0, uVar15 != 0)) {
          uVar17 = (ulong)uVar25;
          uVar28 = uVar15;
        }
      }
      uVar25 = uVar12;
      uVar15 = uVar28;
      lVar13 = lVar13 + 1;
    } while (input.len != lVar13);
  }
  lVar13 = 0x20;
  __ptr = (undefined8 *)aligned_alloc(0x20,(int)uVar17 * 0x180);
  *__ptr = 0x1400000002;
  __ptr[1] = 0x150000000a;
  __ptr[2] = 0x1600000005;
  __ptr[3] = 0x10000000b;
  __ptr[4] = 0x60000000c;
  __ptr[5] = 0x30000000d;
  __ptr[6] = 0x70000000e;
  __ptr[7] = 0xf;
  *(undefined1 (*) [64])(__ptr + 3) = _DAT_00114a58;
  if (uVar15 / 0x17 + (uVar15 / 0x17) * -0x18 + uVar15 == 0) {
    uVar15 = uVar15 / 0x17;
  }
  uVar20 = (ulong)uVar15;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_48,uVar20,&local_49);
  uVar15 = (int)(uVar17 / 0x17) - 1;
  *local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x20;
  if (uVar15 == 0) {
    auVar36 = vpmovsxbd_avx2(ZEXT816(0x1b1f1a1e191d181c));
    auVar44 = ZEXT3264(auVar36);
    auVar36 = vpmovsxbd_avx2(ZEXT816(0x1150b0a16140502));
    auVar45 = ZEXT3264(auVar36);
    pauVar23 = (undefined1 (*) [32])(__ptr + 0xb);
    pauVar26 = (undefined1 (*) [32])(__ptr + 4);
    uVar18 = 0;
    iVar16 = 0x2e;
  }
  else {
    auVar36 = vpmovsxbd_avx2(ZEXT816(0x1b1f1a1e191d181c));
    auVar44 = ZEXT3264(auVar36);
    auVar36 = vpmovsxbd_avx2(ZEXT816(0x1150b0a16140502));
    auVar45 = ZEXT3264(auVar36);
    auVar36 = vpmovsxbd_avx2(ZEXT816(0xe070c050a030801));
    auVar38._8_4_ = 8;
    auVar38._0_8_ = 0x800000008;
    auVar38._12_4_ = 8;
    auVar38._16_4_ = 8;
    auVar38._20_4_ = 8;
    auVar38._24_4_ = 8;
    auVar38._28_4_ = 8;
    auVar4 = vpmovsxbd_avx2(ZEXT816(0x703060205010400));
    auVar5 = vpmovsxbd_avx2(ZEXT816(0x80d080c100e1008));
    auVar6 = vpmovsxbd_avx2(ZEXT816(0x607040205010300));
    auVar7 = vpmovsxbd_avx2(ZEXT816(0x60e07050b0a0301));
    auVar8 = vpmovsxbd_avx2(ZEXT816(0x4000000));
    auVar37._8_4_ = 0x17;
    auVar37._0_8_ = 0x1700000017;
    auVar37._12_4_ = 0x17;
    auVar37._16_4_ = 0x17;
    auVar37._20_4_ = 0x17;
    auVar37._24_4_ = 0x17;
    auVar37._28_4_ = 0x17;
    iVar16 = 0x2e;
    lVar24 = -0x20;
    lVar22 = 0x58;
    uVar18 = 0;
    do {
      auVar43 = auVar44._0_32_;
      auVar35 = vpblendd_avx2(auVar45._0_32_,auVar43,0xaa);
      auVar33 = vpermt2d_avx512vl(auVar45._0_32_,auVar36,auVar43);
      uVar18 = uVar18 + 1;
      *(undefined1 (*) [32])((long)__ptr + lVar22) = auVar35;
      *(undefined1 (*) [32])((long)__ptr + lVar22 + 0x20) = auVar33;
      auVar35 = vpaddd_avx2(auVar43,auVar38);
      auVar33 = vpermd_avx2(auVar4,*(undefined1 (*) [32])((long)__ptr + lVar13));
      auVar9 = vpblendd_avx2(auVar33,auVar35,0xaa);
      auVar34 = vpermt2d_avx512vl(auVar33,auVar36,auVar35);
      auVar35 = vpaddd_avx2(auVar43,auVar5);
      auVar33 = vpaddd_avx2(auVar37,auVar43);
      auVar44 = ZEXT3264(auVar33);
      *(undefined1 (*) [32])((long)__ptr + lVar22 + 0x40) = auVar9;
      *(undefined1 (*) [32])((long)__ptr + lVar22 + 0x60) = auVar34;
      auVar33 = vpermd_avx2(auVar6,*(undefined1 (*) [32])((long)__ptr + lVar13 + 0x20));
      uVar25 = *(int *)((long)__ptr + lVar13 + 0x28) + iVar16;
      if (uVar20 <= uVar18) {
        uVar18 = 0;
      }
      iVar16 = iVar16 + 0x17;
      lVar13 = lVar13 + 0x40;
      auVar9 = vpblendd_avx2(auVar35,auVar33,5);
      auVar35 = vpermt2d_avx512vl(auVar33,auVar7,auVar35);
      *(undefined1 (*) [32])((long)__ptr + lVar22 + 0x80) = auVar9;
      local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar18] =
           local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[uVar18] + (ulong)uVar25;
      lVar1 = (ulong)uVar15 * 0x40 + -0x40 + lVar24;
      lVar22 = lVar22 + 0x94;
      lVar24 = lVar24 + -0x40;
      auVar35 = vpaddd_avx2(auVar35,auVar8);
      auVar45 = ZEXT3264(auVar35);
    } while (lVar1 != -0x20);
    pauVar26 = (undefined1 (*) [32])((long)__ptr - lVar24);
    pauVar23 = (undefined1 (*) [32])(lVar22 + (long)__ptr);
  }
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar21 = 0;
  }
  else {
    auVar39 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar46 = ZEXT1664((undefined1  [16])0x0);
    uVar30 = 0;
    auVar40 = vpbroadcastq_avx512f();
    auVar40 = vpsrlq_avx512f(auVar40,3);
    do {
      auVar41 = vpbroadcastq_avx512f();
      auVar42 = vmovdqa64_avx512f(auVar46);
      auVar46 = vporq_avx512f(auVar41,auVar39);
      uVar10 = vpcmpuq_avx512f(auVar46,auVar40,2);
      auVar41 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                   (local_48.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar30));
      auVar46._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * auVar41._8_8_;
      auVar46._0_8_ = (ulong)((byte)uVar10 & 1) * auVar41._0_8_;
      auVar46._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * auVar41._16_8_;
      auVar46._24_8_ = (ulong)((byte)(uVar10 >> 3) & 1) * auVar41._24_8_;
      auVar46._32_8_ = (ulong)((byte)(uVar10 >> 4) & 1) * auVar41._32_8_;
      auVar46._40_8_ = (ulong)((byte)(uVar10 >> 5) & 1) * auVar41._40_8_;
      auVar46._48_8_ = (ulong)((byte)(uVar10 >> 6) & 1) * auVar41._48_8_;
      auVar46._56_8_ = (uVar10 >> 7) * auVar41._56_8_;
      uVar30 = uVar30 + 8;
      auVar46 = vpmaxuq_avx512f(auVar42,auVar46);
    } while ((((ulong)((long)local_48.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish +
                      (-8 - (long)local_48.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start)) >> 3) + 8 &
             0x3ffffffffffffff8) != uVar30);
    auVar39 = vmovdqa64_avx512f(auVar46);
    bVar3 = (bool)((byte)uVar10 & 1);
    auVar40._0_8_ = (ulong)bVar3 * auVar39._0_8_ | (ulong)!bVar3 * auVar42._0_8_;
    bVar3 = (bool)((byte)(uVar10 >> 1) & 1);
    auVar40._8_8_ = (ulong)bVar3 * auVar39._8_8_ | (ulong)!bVar3 * auVar42._8_8_;
    bVar3 = (bool)((byte)(uVar10 >> 2) & 1);
    auVar40._16_8_ = (ulong)bVar3 * auVar39._16_8_ | (ulong)!bVar3 * auVar42._16_8_;
    bVar3 = (bool)((byte)(uVar10 >> 3) & 1);
    auVar40._24_8_ = (ulong)bVar3 * auVar39._24_8_ | (ulong)!bVar3 * auVar42._24_8_;
    bVar3 = (bool)((byte)(uVar10 >> 4) & 1);
    auVar40._32_8_ = (ulong)bVar3 * auVar39._32_8_ | (ulong)!bVar3 * auVar42._32_8_;
    bVar3 = (bool)((byte)(uVar10 >> 5) & 1);
    auVar40._40_8_ = (ulong)bVar3 * auVar39._40_8_ | (ulong)!bVar3 * auVar42._40_8_;
    bVar3 = (bool)((byte)(uVar10 >> 6) & 1);
    auVar40._48_8_ = (ulong)bVar3 * auVar39._48_8_ | (ulong)!bVar3 * auVar42._48_8_;
    auVar40._56_8_ = (uVar10 >> 7) * auVar39._56_8_ | (ulong)!SUB81(uVar10 >> 7,0) * auVar42._56_8_;
    auVar36 = vextracti64x4_avx512f(auVar40,1);
    auVar39 = vpmaxuq_avx512f(auVar40,ZEXT3264(auVar36));
    auVar31 = vpmaxuq_avx512vl(auVar39._0_16_,auVar39._16_16_);
    auVar32 = vpshufd_avx(auVar31,0xee);
    auVar32 = vpmaxuq_avx512vl(auVar31,auVar32);
    uVar21 = auVar32._0_8_;
  }
  uVar28 = (int)uVar17 * 100;
  uVar15 = (((uint)((ulong)uVar28 * 0xb21642c9 >> 0x20) & 0xfffffff0) + 0x30) / 0x25;
  uVar25 = uVar15 - (int)(uVar17 / 0x17);
  if (uVar25 != 0) {
    auVar36 = vpmovsxbd_avx2(ZEXT816(0xe070c050a030801));
    auVar35._8_4_ = 8;
    auVar35._0_8_ = 0x800000008;
    auVar35._12_4_ = 8;
    auVar35._16_4_ = 8;
    auVar35._20_4_ = 8;
    auVar35._24_4_ = 8;
    auVar35._28_4_ = 8;
    auVar4 = vpmovsxbd_avx2(ZEXT816(0x703060205010400));
    auVar5 = vpmovsxbd_avx2(ZEXT816(0x80d080c100e1008));
    auVar6 = vpmovsxbd_avx2(ZEXT816(0x607040205010300));
    auVar7 = vpmovsxbd_avx2(ZEXT816(0x60e07050b0a0301));
    auVar8 = vpmovsxbd_avx2(ZEXT816(0x4000000));
    auVar33._8_4_ = 0x17;
    auVar33._0_8_ = 0x1700000017;
    auVar33._12_4_ = 0x17;
    auVar33._16_4_ = 0x17;
    auVar33._20_4_ = 0x17;
    auVar33._24_4_ = 0x17;
    auVar33._28_4_ = 0x17;
    lVar13 = -(ulong)uVar25;
    do {
      auVar43 = auVar44._0_32_;
      auVar38 = vpblendd_avx2(auVar45._0_32_,auVar43,0xaa);
      auVar37 = vpermt2d_avx512vl(auVar45._0_32_,auVar36,auVar43);
      uVar18 = uVar18 + 1;
      *pauVar23 = auVar38;
      pauVar23[1] = auVar37;
      auVar38 = vpaddd_avx2(auVar43,auVar35);
      auVar37 = vpermd_avx2(auVar4,*pauVar26);
      auVar9 = vpblendd_avx2(auVar37,auVar38,0xaa);
      auVar34 = vpermt2d_avx512vl(auVar37,auVar36,auVar38);
      auVar38 = vpaddd_avx2(auVar43,auVar5);
      auVar37 = vpaddd_avx2(auVar33,auVar43);
      auVar44 = ZEXT3264(auVar37);
      pauVar23[2] = auVar9;
      pauVar23[3] = auVar34;
      auVar37 = vpermd_avx2(auVar6,pauVar26[1]);
      pauVar11 = pauVar26 + 1;
      pauVar26 = pauVar26 + 2;
      uVar25 = *(int *)((long)*pauVar11 + 8) + iVar16;
      if (uVar20 <= uVar18) {
        uVar18 = 0;
      }
      iVar16 = iVar16 + 0x17;
      auVar9 = vpblendd_avx2(auVar38,auVar37,5);
      auVar38 = vpermt2d_avx512vl(auVar37,auVar7,auVar38);
      pauVar23[4] = auVar9;
      local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar18] =
           local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[uVar18] + (ulong)uVar25;
      pauVar23 = (undefined1 (*) [32])((long)pauVar23[4] + 0x14);
      lVar13 = lVar13 + 1;
      auVar38 = vpaddd_avx2(auVar38,auVar8);
      auVar45 = ZEXT3264(auVar38);
    } while (lVar13 != 0);
  }
  iVar29 = uVar28 / 0x17 - uVar15;
  if (iVar29 != 0) {
    piVar27 = (int *)((long)pauVar26[1] + 8);
    do {
      iVar2 = *piVar27;
      uVar18 = uVar18 + 1;
      if (uVar20 <= uVar18) {
        uVar18 = 0;
      }
      piVar27 = piVar27 + 0x10;
      uVar15 = iVar2 + iVar16;
      iVar16 = iVar16 + 0x17;
      local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar18] =
           local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[uVar18] + (ulong)uVar15;
      iVar29 = iVar29 + -1;
    } while (iVar29 != 0);
  }
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar19 = 0;
  }
  else {
    auVar44 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar39 = ZEXT1664((undefined1  [16])0x0);
    uVar17 = 0;
    auVar45 = vpbroadcastq_avx512f();
    auVar45 = vpsrlq_avx512f(auVar45,3);
    do {
      auVar40 = vpbroadcastq_avx512f();
      auVar46 = vmovdqa64_avx512f(auVar39);
      auVar39 = vporq_avx512f(auVar40,auVar44);
      uVar20 = vpcmpuq_avx512f(auVar39,auVar45,2);
      auVar39 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                   (local_48.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar17));
      auVar41._8_8_ = (ulong)((byte)(uVar20 >> 1) & 1) * auVar39._8_8_;
      auVar41._0_8_ = (ulong)((byte)uVar20 & 1) * auVar39._0_8_;
      auVar41._16_8_ = (ulong)((byte)(uVar20 >> 2) & 1) * auVar39._16_8_;
      auVar41._24_8_ = (ulong)((byte)(uVar20 >> 3) & 1) * auVar39._24_8_;
      auVar41._32_8_ = (ulong)((byte)(uVar20 >> 4) & 1) * auVar39._32_8_;
      auVar41._40_8_ = (ulong)((byte)(uVar20 >> 5) & 1) * auVar39._40_8_;
      auVar41._48_8_ = (ulong)((byte)(uVar20 >> 6) & 1) * auVar39._48_8_;
      auVar41._56_8_ = (uVar20 >> 7) * auVar39._56_8_;
      uVar17 = uVar17 + 8;
      auVar39 = vpmaxuq_avx512f(auVar46,auVar41);
    } while ((((ulong)((long)local_48.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish +
                      (-8 - (long)local_48.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start)) >> 3) + 8 &
             0x3ffffffffffffff8) != uVar17);
    auVar44 = vmovdqa64_avx512f(auVar39);
    bVar3 = (bool)((byte)uVar20 & 1);
    auVar45._0_8_ = (ulong)bVar3 * auVar44._0_8_ | (ulong)!bVar3 * auVar46._0_8_;
    bVar3 = (bool)((byte)(uVar20 >> 1) & 1);
    auVar45._8_8_ = (ulong)bVar3 * auVar44._8_8_ | (ulong)!bVar3 * auVar46._8_8_;
    bVar3 = (bool)((byte)(uVar20 >> 2) & 1);
    auVar45._16_8_ = (ulong)bVar3 * auVar44._16_8_ | (ulong)!bVar3 * auVar46._16_8_;
    bVar3 = (bool)((byte)(uVar20 >> 3) & 1);
    auVar45._24_8_ = (ulong)bVar3 * auVar44._24_8_ | (ulong)!bVar3 * auVar46._24_8_;
    bVar3 = (bool)((byte)(uVar20 >> 4) & 1);
    auVar45._32_8_ = (ulong)bVar3 * auVar44._32_8_ | (ulong)!bVar3 * auVar46._32_8_;
    bVar3 = (bool)((byte)(uVar20 >> 5) & 1);
    auVar45._40_8_ = (ulong)bVar3 * auVar44._40_8_ | (ulong)!bVar3 * auVar46._40_8_;
    bVar3 = (bool)((byte)(uVar20 >> 6) & 1);
    auVar45._48_8_ = (ulong)bVar3 * auVar44._48_8_ | (ulong)!bVar3 * auVar46._48_8_;
    auVar45._56_8_ = (uVar20 >> 7) * auVar44._56_8_ | (ulong)!SUB81(uVar20 >> 7,0) * auVar46._56_8_;
    auVar36 = vextracti64x4_avx512f(auVar45,1);
    auVar44 = vpmaxuq_avx512f(auVar45,ZEXT3264(auVar36));
    auVar31 = vpmaxuq_avx512vl(auVar44._0_16_,auVar44._16_16_);
    auVar32 = vpshufd_avx(auVar31,0xee);
    auVar32 = vpmaxuq_avx512vl(auVar31,auVar32);
    uVar19 = auVar32._0_8_;
  }
  printf("Day 09 Part 1: %lu\nDay 09 Part 2: %lu\n",uVar21,uVar19);
  free(__ptr);
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void day09(input_t input) {
	uint32_t n_players = 0, n_points = 0;
	for (uint32_t n = 0; input.len--; input.s++) {
		uint8_t c = *input.s - '0';
		if (c < 10) {
			n = 10 * n + c;
		} else if (n && *input.s == ' ') {
			(n_players ? n_points : n_players) = n;
			n = 0;
		}
	}

	// State after first round, from puzzle description
	constexpr std::array<int32_t, 22> initial = {
		 2, 20, 10, 21,  5, 22, 11,  1, 12,  6, 13,
		 3, 14,  7, 15,  0, 16,  8, 17,  4, 18, 19,
	};

	// Next marbles up for play, interleaved
	auto new_marbles = _mm256_setr_epi32(28, 24, 29, 25, 30, 26, 31, 27);

	// Initialize the playing field
	auto marbles = (int32_t *) aligned_alloc(32, n_points * 384);
	std::copy(initial.begin(), initial.end(), marbles);
	auto Mnext = marbles, Mend = marbles + 22;

	// Initialize score sheet
	if (n_players % 23 == 0) {
		n_players /= 23;
	}
	size_t cur_player = 0;
	std::vector<uint64_t> score(n_players);
	score[cur_player] = 32;

	const auto append = [&](size_t step, const __m256i& v) {
		_mm256_storeu_si256((__m256i *) Mend, v);
		Mend += step;
	};

	const auto load_next = [&]() {
		auto m = _mm256_load_si256((__m256i *) Mnext);
		Mnext += 8;
		return m;
	};

	// Prime the AVX2 register with the first group of 8 marbles
	auto M = _mm256_permutevar8x32_epi32(load_next(), _mm256_setr_epi32(0, 4, 1, 5, 2, 6, 3, 7));

	uint32_t turn = 46;

	auto simulate = [&](size_t count) {
		for (; count--; turn += 23) {
			// First 8 turns
			append(8, _mm256_blend_epi32(M, new_marbles, 0xaa));
			append(8, _mm256_shuffle_epi32(_mm256_blend_epi32(M, new_marbles, 0x55), 0xb1));

			new_marbles = _mm256_add_epi32(new_marbles, _mm256_set1_epi32(8));

			// Next 8 turns
			M = _mm256_permutevar8x32_epi32(load_next(), _mm256_setr_epi32(0, 4, 1, 5, 2, 6, 3, 7));
			append(8, _mm256_blend_epi32(M, new_marbles, 0xaa));
			append(8, _mm256_shuffle_epi32(_mm256_blend_epi32(M, new_marbles, 0x55), 0xb1));

			new_marbles = _mm256_add_epi32(new_marbles, _mm256_setr_epi32(0, 8, 6, 8, 4, 0, 5, 0));

			// Final 7 turns
			M = _mm256_permutevar8x32_epi32(load_next(), _mm256_setr_epi32(0, 3, 1, 5, 2, 4, 7, 6));
			append(5, _mm256_blend_epi32(M, new_marbles, 0xfa));

			cur_player++;
			cur_player &= -(cur_player < n_players);
			score[cur_player] += turn + _mm256_extract_epi32(M, 4);

			// Prepare the first 8 marbles of the next round
			M = _mm256_blend_epi32(_mm256_shuffle_epi32(M, 0x8d), new_marbles, 0x4c);
			M = _mm256_add_epi32(M, _mm256_setr_epi32(0, 0, 0, 4, 0, 0, 0, 0));

			new_marbles = _mm256_add_epi32(new_marbles, _mm256_setr_epi32(15, 7, 9, 7, 11, 15, 10, 15));
		}
	};

	// Part 1
	auto n_rounds1 = n_points / 23;
	simulate(n_rounds1 - 1);
	uint64_t part1 = 0;

	for (auto&& s : score) {
		part1 = std::max(part1, s);
	}

	// Part 2: 100x the number of points
	auto n_rounds2 = 100 * n_points / 23;

	// Simulate only enough to generate the scoreballs
	auto n_simulate2 = (n_rounds2 + 3) * 16 / 37;
	simulate(n_simulate2 - n_rounds1);
	n_rounds2 -= n_simulate2;

	// Tally up the remaining scoreballs
	for (Mnext += 10; n_rounds2--; Mnext += 16, turn += 23) {
		cur_player++;
		cur_player &= -(cur_player < n_players);
		score[cur_player] += turn + *Mnext;
	}

	uint64_t part2 = 0;
	for (auto&& s : score) {
		part2 = std::max(part2, s);
	}

	printf("Day 09 Part 1: %lu\nDay 09 Part 2: %lu\n", part1, part2);

	free(marbles);
}